

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::initGMTPattern
          (TimeZoneFormat *this,UnicodeString *gmtPattern,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_b8;
  UnicodeString local_68;
  int32_t local_24;
  UErrorCode *pUStack_20;
  int32_t idx;
  UErrorCode *status_local;
  UnicodeString *gmtPattern_local;
  TimeZoneFormat *this_local;
  
  pUStack_20 = status;
  status_local = (UErrorCode *)gmtPattern;
  gmtPattern_local = (UnicodeString *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    local_24 = UnicodeString::indexOf((UnicodeString *)status_local,L"{0}mm",3,0);
    if (local_24 < 0) {
      *pUStack_20 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeString::setTo(&this->fGMTPattern,(UnicodeString *)status_local);
      UnicodeString::tempSubString(&local_68,(UnicodeString *)status_local,0,local_24);
      unquote(&local_68,&this->fGMTPatternPrefix);
      UnicodeString::~UnicodeString(&local_68);
      UnicodeString::tempSubString(&local_b8,(UnicodeString *)status_local,local_24 + 3,0x7fffffff);
      unquote(&local_b8,&this->fGMTPatternSuffix);
      UnicodeString::~UnicodeString(&local_b8);
    }
  }
  return;
}

Assistant:

void
TimeZoneFormat::initGMTPattern(const UnicodeString& gmtPattern, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    // This implementation not perfect, but sufficient practically.
    int32_t idx = gmtPattern.indexOf(ARG0, ARG0_LEN, 0);
    if (idx < 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    fGMTPattern.setTo(gmtPattern);
    unquote(gmtPattern.tempSubString(0, idx), fGMTPatternPrefix);
    unquote(gmtPattern.tempSubString(idx + ARG0_LEN), fGMTPatternSuffix);
}